

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsslserver.cpp
# Opt level: O0

int __thiscall QSslServer::qt_metacall(QSslServer *this,Call _c,int _id,void **_a)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  void **in_stack_00000078;
  int in_stack_00000080;
  Call in_stack_00000084;
  QObject *in_stack_00000088;
  undefined4 local_4;
  
  local_4 = QTcpServer::qt_metacall
                      ((QTcpServer *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),
                       (int)in_RCX,in_RDI);
  if (-1 < local_4) {
    if (in_ESI == 0) {
      if (local_4 < 8) {
        qt_static_metacall(in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
      }
      local_4 = local_4 + -8;
    }
    if (in_ESI == 7) {
      if (local_4 < 8) {
        qt_static_metacall(in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
      }
      local_4 = local_4 + -8;
    }
  }
  return local_4;
}

Assistant:

int QSslServer::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QTcpServer::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 8)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 8;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 8)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 8;
    }
    return _id;
}